

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O2

void agentf_set_input_wanted(Channel *chan,_Bool wanted)

{
  if (chan->vt != &agentf_channelvt) {
    __assert_fail("chan->vt == &agentf_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/agentf.c",
                  0xee,"void agentf_set_input_wanted(Channel *, _Bool)");
  }
  *(_Bool *)&chan[-1].initial_fixed_window_size = wanted;
  if (wanted) {
    agentf_try_forward((agentf *)(chan + -4));
    return;
  }
  return;
}

Assistant:

static void agentf_set_input_wanted(Channel *chan, bool wanted)
{
    assert(chan->vt == &agentf_channelvt);
    agentf *af = container_of(chan, agentf, chan);

    af->input_wanted = wanted;

    /* Agent forwarding channels are buffer-managed by not asking the
     * agent questions if the SSH channel isn't accepting input. So if
     * it's started again, we should ask a question if we have one
     * pending.. */
    if (wanted)
        agentf_try_forward(af);
}